

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::
       fill<kj::ArrayPtr<kj::String_const>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<kj::StringPtr_const>>>
                 (char *target,Delimited<kj::ArrayPtr<const_kj::String>_> *first,StringPtr *rest,
                 Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *rest_1)

{
  size_t sVar1;
  char *target_00;
  char *pcVar2;
  long lVar3;
  
  target_00 = Delimited<kj::ArrayPtr<const_kj::String>_>::flattenTo(first,target);
  pcVar2 = (rest->content).ptr;
  sVar1 = (rest->content).size_;
  if (pcVar2 != pcVar2 + (sVar1 - 1)) {
    lVar3 = 0;
    do {
      target_00[lVar3] = pcVar2[lVar3];
      lVar3 = lVar3 + 1;
    } while (sVar1 - 1 != lVar3);
    target_00 = target_00 + lVar3;
  }
  pcVar2 = Delimited<kj::ArrayPtr<const_kj::StringPtr>_>::flattenTo(rest_1,target_00);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, Delimited<T>&& first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}